

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

SpatialSplit * __thiscall
embree::avx::
HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
parallel_spatial_find
          (SpatialSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize)

{
  char *pcVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  char cVar4;
  long lVar5;
  runtime_error *this_00;
  vuint4 *pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  SpatialBinMapping<16UL> mapping;
  task_group_context context;
  SpatialBinner binner;
  task_group_context *in_stack_ffffffffffffee40;
  undefined1 local_1181 [9];
  undefined8 uStack_1178;
  HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
  *local_1170;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1168;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1160;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1150;
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1120;
  undefined8 local_1110;
  task_group_context local_1100;
  SpatialBinInfo<16UL,_embree::PrimRef> local_1080;
  SpatialBinInfo<16UL,_embree::PrimRef> local_880;
  
  pvVar6 = local_1080.numEnd;
  for (lVar5 = 0x50; lVar5 != 0x650; lVar5 = lVar5 + 0x60) {
    pcVar1 = local_1100.padding + lVar5 + 0x28;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = '\x7f';
    pcVar1 = local_1100.padding + lVar5 + 0x2c;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = '\x7f';
    pcVar1 = local_1100.padding + lVar5 + 0x30;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = '\x7f';
    pcVar1 = local_1100.padding + lVar5 + 0x34;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = '\x7f';
    *(undefined4 *)((long)&local_1080.bounds[0][0].lower.field_0 + lVar5) = 0xff800000;
    *(undefined4 *)((long)&local_1080.bounds[0][0].lower.field_0 + lVar5 + 4) = 0xff800000;
    *(undefined4 *)((long)&local_1080.bounds[0][0].lower.field_0 + lVar5 + 8) = 0xff800000;
    *(undefined4 *)((long)&local_1080.bounds[0][0].lower.field_0 + lVar5 + 0xc) = 0xff800000;
    pcVar1 = local_1100.padding + lVar5 + 8;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = '\x7f';
    pcVar1 = local_1100.padding + lVar5 + 0xc;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = '\x7f';
    pcVar1 = local_1100.padding + lVar5 + 0x10;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = '\x7f';
    pcVar1 = local_1100.padding + lVar5 + 0x14;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = '\x7f';
    pcVar1 = local_1100.padding + lVar5 + 0x18;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = -1;
    pcVar1 = local_1100.padding + lVar5 + 0x1c;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = -1;
    pcVar1 = local_1100.padding + lVar5 + 0x20;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = -1;
    pcVar1 = local_1100.padding + lVar5 + 0x24;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = -1;
    pcVar1 = local_1100.padding + lVar5 + -0x18;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = '\x7f';
    pcVar1 = local_1100.padding + lVar5 + -0x14;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = '\x7f';
    pcVar1 = local_1100.padding + lVar5 + -0x10;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = '\x7f';
    pcVar1 = local_1100.padding + lVar5 + -0xc;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = '\x7f';
    pcVar1 = local_1100.padding + lVar5 + -8;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = -1;
    pcVar1 = local_1100.padding + lVar5 + -4;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = -1;
    pcVar1 = local_1100.padding + lVar5;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = -1;
    pcVar1 = local_1100.padding + lVar5 + 4;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = -0x80;
    pcVar1[3] = -1;
    (pvVar6->field_0).v[0] = 0;
    (pvVar6->field_0).v[1] = 0;
    pvVar6[-0x10].field_0.v[0] = 0;
    pvVar6[-0x10].field_0.v[1] = 0;
    pvVar6 = pvVar6 + 1;
  }
  local_1150 = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0;
  aVar2 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0;
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx((undefined1  [16])local_1150,auVar8);
  auVar8 = vandps_avx((undefined1  [16])aVar2,auVar8);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar9._0_4_ = auVar7._0_4_ * 1.5258789e-05;
  auVar9._4_4_ = auVar7._4_4_ * 1.5258789e-05;
  auVar9._8_4_ = auVar7._8_4_ * 1.5258789e-05;
  auVar9._12_4_ = auVar7._12_4_ * 1.5258789e-05;
  auVar3 = vsubps_avx((undefined1  [16])aVar2,(undefined1  [16])local_1150);
  auVar7 = vmaxps_avx(auVar9,auVar3);
  auVar10._8_4_ = 0x41800000;
  auVar10._0_8_ = 0x4180000041800000;
  auVar10._12_4_ = 0x41800000;
  auVar8 = vdivps_avx(auVar10,auVar7);
  auVar7 = vcmpps_avx(auVar3,auVar9,6);
  local_1140 = vandps_avx(auVar7,auVar8);
  local_1168 = &local_1150;
  auVar7._8_4_ = 0x3f800000;
  auVar7._0_8_ = 0x3f8000003f800000;
  auVar7._12_4_ = 0x3f800000;
  local_1130 = vdivps_avx(auVar7,local_1140);
  unique0x00108a80 =
       vpermilps_avx((undefined1  [16])
                     (set->super_extended_range<unsigned_long>).super_range<unsigned_long>,0x4e);
  local_1170 = this;
  tbb::detail::d1::task_group_context::task_group_context
            (&local_1100,(context_traits)0x4,CUSTOM_CTX);
  local_1120._0_8_ = local_1181._1_8_;
  local_1120._8_8_ = uStack_1178;
  local_1110 = 0x400;
  local_1160._0_8_ = local_1181;
  local_1160._8_8_ = &local_1170;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::avx::SpatialBinInfo<16ul,embree::PrimRef>,embree::parallel_reduce<unsigned_long,embree::avx::SpatialBinInfo<16ul,embree::PrimRef>,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::avx::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::range<unsigned_long>const&)_1_,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::avx::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::avx::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::avx::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::avx::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_>
            (&local_880,(d1 *)&local_1120.field_1,(blocked_range<unsigned_long> *)&local_1080,
             (SpatialBinInfo<16UL,_embree::PrimRef> *)&local_1160.field_1,
             (anon_class_16_2_ed117de8_conflict6 *)local_1160._0_8_,
             (anon_class_1_0_00000001 *)&local_1100,in_stack_ffffffffffffee40);
  cVar4 = tbb::detail::r1::is_group_execution_cancelled(&local_1100);
  if (cVar4 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&local_1100);
    SpatialBinInfo<16UL,_embree::PrimRef>::operator=(&local_1080,&local_880);
    SpatialBinInfo<16UL,_embree::PrimRef>::best
              (__return_storage_ptr__,&local_1080,(SpatialBinMapping<16UL> *)&local_1150.field_1,
               logBlockSize);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

parallel_spatial_find(const PrimInfoExtRange& set, const size_t logBlockSize)
        {
          SpatialBinner binner(empty);
          const SpatialBinMapping<SPATIAL_BINS> mapping(set);
          const SpatialBinMapping<SPATIAL_BINS>& _mapping = mapping; // CLANG 3.4 parser bug workaround
          binner = parallel_reduce(set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,binner,
                                   [&] (const range<size_t>& r) -> SpatialBinner { 
                                     SpatialBinner binner(empty); 
                                     binner.bin2(splitterFactory,prims0,r.begin(),r.end(),_mapping);
                                     return binner; },
                                   [&] (const SpatialBinner& b0, const SpatialBinner& b1) -> SpatialBinner { return SpatialBinner::reduce(b0,b1); });
          /* todo: best spatial split not exceeding the extended range does not provide any benefit ?*/
          return binner.best(mapping,logBlockSize); //,set.ext_size());
        }